

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_info.hpp
# Opt level: O0

Type_Info *
chaiscript::detail::
Get_Type_Info<chaiscript::bootstrap::standard_library::Bidir_Range<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::get(void)

{
  Type_Info *in_RDI;
  
  Type_Info::Type_Info
            (in_RDI,false,false,false,false,false,
             (type_info *)
             &bootstrap::standard_library::
              Bidir_Range<std::__cxx11::string,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ::typeinfo,
             (type_info *)
             &bootstrap::standard_library::
              Bidir_Range<std::__cxx11::string,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ::typeinfo);
  return in_RDI;
}

Assistant:

constexpr static Type_Info get() noexcept {
        return Type_Info(std::is_const<typename std::remove_pointer<typename std::remove_reference<T>::type>::type>::value,
                         std::is_reference<T>::value,
                         std::is_pointer<T>::value,
                         std::is_void<T>::value,
                         (std::is_arithmetic<T>::value || std::is_arithmetic<typename std::remove_reference<T>::type>::value)
                             && !std::is_same<typename std::remove_const<typename std::remove_reference<T>::type>::type, bool>::value,
                         &typeid(T),
                         &typeid(typename Bare_Type<T>::type));
      }